

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::SpecifyBlockSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,SpecifyBlockSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  SyntaxNode *local_70;
  SyntaxNode *local_60;
  size_t index_local;
  SpecifyBlockSyntax *this_local;
  
  switch(index) {
  case 0:
    local_60 = (SyntaxNode *)0x0;
    if (this != (SpecifyBlockSyntax *)0xfffffffffffffff0) {
      local_60 = &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_60);
    break;
  case 1:
    token.kind = (this->specify).kind;
    token._2_1_ = (this->specify).field_0x2;
    token.numFlags.raw = (this->specify).numFlags.raw;
    token.rawLen = (this->specify).rawLen;
    token.info = (this->specify).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 2:
    local_70 = (SyntaxNode *)0x0;
    if (this != (SpecifyBlockSyntax *)0xffffffffffffffb0) {
      local_70 = &(this->items).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 3:
    token_00.kind = (this->endspecify).kind;
    token_00._2_1_ = (this->endspecify).field_0x2;
    token_00.numFlags.raw = (this->endspecify).numFlags.raw;
    token_00.rawLen = (this->endspecify).rawLen;
    token_00.info = (this->endspecify).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax SpecifyBlockSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return &attributes;
        case 1: return specify;
        case 2: return &items;
        case 3: return endspecify;
        default: return nullptr;
    }
}